

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,Value *other)

{
  Value *other_local;
  Value *this_local;
  
  initBasic(this,nullValue,false);
  swap(this,other);
  return;
}

Assistant:

Value::Value(Value&& other) {
  initBasic(nullValue);
  swap(other);
}